

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

bool __thiscall
density::
lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
::try_emplace<std::__cxx11::string,std::__cxx11::string>
          (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
           *this,progress_guarantee i_progress_guarantee,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_construction_params)

{
  void *pvVar1;
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tranasction;
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  try_start_emplace<std::__cxx11::string,std::__cxx11::string>
            (&local_28,this,i_progress_guarantee,i_construction_params);
  local_48.m_put.m_control_block = local_28.m_put.m_control_block;
  local_48.m_put.m_next_ptr = local_28.m_put.m_next_ptr;
  local_48.m_put.m_user_storage = local_28.m_put.m_user_storage;
  local_48.m_queue = local_28.m_queue;
  local_28.m_put.m_user_storage = (void *)0x0;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction(&local_28);
  pvVar1 = local_48.m_put.m_user_storage;
  if (local_48.m_put.m_user_storage != (void *)0x0) {
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::
    put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::commit(&local_48);
  }
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction(&local_48);
  return pvVar1 != (void *)0x0;
}

Assistant:

bool
          try_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(std::declval<lf_heter_queue>().template try_start_emplace<ELEMENT_TYPE>(
              i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)))
        {
            auto tranasction = try_start_emplace<ELEMENT_TYPE>(
              i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            if (!tranasction)
                return false;
            tranasction.commit();
            return true;
        }